

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

string * __thiscall
Corrade::Utility::Arguments::prefix_abi_cxx11_(string *__return_storage_ptr__,Arguments *this)

{
  ulong uVar1;
  Arguments *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->_prefix);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Arguments::prefix() const {
    return _prefix.empty() ? std::string{} : _prefix.substr(0, _prefix.size() - 1);
}